

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# INumberJudger.cpp
# Opt level: O2

bool __thiscall INumberJudger::isNumber(INumberJudger *this,string *s)

{
  uint uVar1;
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  iterator iVar2;
  _Map_base<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_01;
  mapped_type *pmVar3;
  byte bVar4;
  long lVar5;
  ulong uVar6;
  CharType typ;
  unordered_map<INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>,_std::hash<INumberJudger::State>,_std::equal_to<INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>_>_>
  transfer;
  State st;
  undefined1 local_621;
  undefined1 local_620;
  undefined1 local_61f;
  undefined1 local_61e;
  undefined1 local_61d;
  undefined1 local_61c;
  undefined1 local_61b;
  undefined1 local_61a;
  undefined1 local_619;
  undefined1 local_618;
  undefined1 local_617;
  undefined1 local_616;
  undefined1 local_615;
  undefined1 local_614;
  undefined1 local_613;
  undefined1 local_612;
  undefined1 local_611;
  undefined1 local_610;
  undefined1 local_60f;
  undefined1 local_60e;
  undefined1 local_60d;
  undefined1 local_60c;
  undefined1 local_60b;
  undefined1 local_60a;
  undefined1 local_609;
  undefined1 local_608;
  undefined1 local_607;
  undefined1 local_606;
  undefined1 local_605;
  undefined1 local_604;
  undefined1 local_603;
  undefined1 local_602;
  undefined1 local_601;
  string *local_600;
  INumberJudger *local_5f8;
  undefined8 local_5f0;
  undefined8 local_5e8;
  undefined8 local_5e0;
  undefined4 local_5d8;
  undefined4 uStack_5d4;
  undefined4 uStack_5d0;
  undefined4 uStack_5cc;
  undefined4 local_5c8;
  undefined4 uStack_5c4;
  undefined4 uStack_5c0;
  undefined4 uStack_5bc;
  undefined4 local_5b8;
  undefined4 uStack_5b4;
  undefined4 uStack_5b0;
  undefined4 uStack_5ac;
  undefined1 local_5a8 [8];
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_5a0;
  undefined4 local_568;
  undefined4 uStack_564;
  undefined4 uStack_560;
  undefined4 uStack_55c;
  undefined8 local_558;
  undefined1 local_550 [8];
  undefined4 local_548;
  undefined4 uStack_544;
  undefined4 uStack_540;
  undefined4 uStack_53c;
  undefined8 local_538;
  undefined1 local_530 [8];
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_528;
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_4f0;
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_4b8;
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_480;
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_448;
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_410;
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_3d8;
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_3a0;
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_368;
  _Hashtable<INumberJudger::State,_std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>,_std::allocator<std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::State>,_std::hash<INumberJudger::State>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_330;
  undefined4 local_2f8;
  undefined4 uStack_2f4;
  undefined4 uStack_2f0;
  undefined4 uStack_2ec;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined4 local_2d8;
  undefined4 uStack_2d4;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined1 local_2b8 [8];
  undefined1 local_2b0 [64];
  undefined4 local_270;
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_268;
  undefined4 local_230;
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_228;
  undefined4 local_1f0;
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_1e8;
  undefined4 local_1b0;
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_1a8;
  undefined4 local_170;
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_168;
  undefined4 local_130;
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_128;
  undefined4 local_f0;
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_e8;
  undefined4 local_b0;
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_a8;
  undefined4 local_70;
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_2c8 = 0x400000002;
  uStack_2c0 = 0x100000003;
  local_2d8 = 4;
  uStack_2d4 = 0;
  uStack_2d0 = 0;
  uStack_2cc = 2;
  local_600 = s;
  local_5f8 = this;
  std::
  _Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<INumberJudger::CharType_const,INumberJudger::State>const*>
            ((_Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_5a0,&local_2d8,local_2b8,0,&local_601,&local_602,&local_603);
  local_2b0._0_4_ = STATE_INITIAL;
  std::
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable((_Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)(local_2b0 + 8),&local_5a0);
  local_5b8 = 0;
  uStack_5b4 = 2;
  uStack_5b0 = 2;
  uStack_5ac = 4;
  std::
  _Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<INumberJudger::CharType_const,INumberJudger::State>const*>
            ((_Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_368,&local_5b8,local_5a8,0,&local_604,&local_605,&local_606);
  local_270 = 1;
  std::
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&local_268,&local_368);
  local_2e8 = 0x300000002;
  uStack_2e0 = 0x900000004;
  local_2f8 = 0;
  uStack_2f4 = 2;
  uStack_2f0 = 1;
  uStack_2ec = 6;
  std::
  _Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<INumberJudger::CharType_const,INumberJudger::State>const*>
            ((_Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_3a0,&local_2f8,&local_2d8,0,&local_607,&local_608,&local_609);
  local_230 = 2;
  std::
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&local_228,&local_3a0);
  local_548 = 0;
  uStack_544 = 5;
  uStack_540 = 1;
  uStack_53c = 6;
  local_538 = 0x900000004;
  std::
  _Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<INumberJudger::CharType_const,INumberJudger::State>const*>
            ((_Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_3d8,&local_548,local_530,0,&local_60a,&local_60b,&local_60c);
  local_1f0 = 3;
  std::
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&local_1e8,&local_3d8);
  local_5e0 = 0x500000000;
  std::
  _Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<INumberJudger::CharType_const,INumberJudger::State>const*>
            ((_Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_410,&local_5e0,&local_5d8,0,&local_60d,&local_60e,&local_60f);
  local_1b0 = 4;
  std::
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&local_1a8,&local_410);
  local_568 = 0;
  uStack_564 = 5;
  uStack_560 = 1;
  uStack_55c = 6;
  local_558 = 0x900000004;
  std::
  _Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<INumberJudger::CharType_const,INumberJudger::State>const*>
            ((_Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_448,&local_568,local_550,0,&local_610,&local_611,&local_612);
  local_170 = 5;
  std::
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&local_168,&local_448);
  local_5c8 = 0;
  uStack_5c4 = 8;
  uStack_5c0 = 3;
  uStack_5bc = 7;
  std::
  _Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<INumberJudger::CharType_const,INumberJudger::State>const*>
            ((_Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_480,&local_5c8,&local_5b8,0,&local_613,&local_614,&local_615);
  local_130 = 6;
  std::
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&local_128,&local_480);
  local_5e8 = 0x800000000;
  std::
  _Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<INumberJudger::CharType_const,INumberJudger::State>const*>
            ((_Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_4b8,&local_5e8,&local_5e0,0,&local_616,&local_617,&local_618);
  local_f0 = 7;
  std::
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&local_e8,&local_4b8);
  local_5d8 = 0;
  uStack_5d4 = 8;
  uStack_5d0 = 4;
  uStack_5cc = 9;
  std::
  _Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<INumberJudger::CharType_const,INumberJudger::State>const*>
            ((_Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_4f0,&local_5d8,&local_5c8,0,&local_619,&local_61a,&local_61b);
  local_b0 = 8;
  std::
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&local_a8,&local_4f0);
  local_5f0 = 0x900000004;
  std::
  _Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<INumberJudger::CharType_const,INumberJudger::State>const*>
            ((_Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_528,&local_5f0,&local_5e8,0,&local_61c,&local_61d,&local_61e);
  local_70 = 9;
  std::
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&local_68,&local_528);
  std::
  _Hashtable<INumberJudger::State,std::pair<INumberJudger::State_const,std::unordered_map<INumberJudger::CharType,INumberJudger::State,std::hash<INumberJudger::CharType>,std::equal_to<INumberJudger::CharType>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>>>,std::allocator<std::pair<INumberJudger::State_const,std::unordered_map<INumberJudger::CharType,INumberJudger::State,std::hash<INumberJudger::CharType>,std::equal_to<INumberJudger::CharType>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>>>>,std::__detail::_Select1st,std::equal_to<INumberJudger::State>,std::hash<INumberJudger::State>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _Hashtable<std::pair<INumberJudger::State_const,std::unordered_map<INumberJudger::CharType,INumberJudger::State,std::hash<INumberJudger::CharType>,std::equal_to<INumberJudger::CharType>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>>>const*>
            ((_Hashtable<INumberJudger::State,std::pair<INumberJudger::State_const,std::unordered_map<INumberJudger::CharType,INumberJudger::State,std::hash<INumberJudger::CharType>,std::equal_to<INumberJudger::CharType>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>>>,std::allocator<std::pair<INumberJudger::State_const,std::unordered_map<INumberJudger::CharType,INumberJudger::State,std::hash<INumberJudger::CharType>,std::equal_to<INumberJudger::CharType>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>>>>,std::__detail::_Select1st,std::equal_to<INumberJudger::State>,std::hash<INumberJudger::State>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_330,local_2b0,&stack0xffffffffffffffd0,0,&local_61f,&local_620,&local_621);
  lVar5 = 0x248;
  do {
    std::
    _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)(local_2b0 + lVar5));
    lVar5 = lVar5 + -0x40;
  } while (lVar5 != -0x38);
  std::
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_528);
  std::
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_4f0);
  std::
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_4b8);
  std::
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_480);
  std::
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_448);
  std::
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_410);
  std::
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_3d8);
  std::
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_3a0);
  std::
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_368);
  std::
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_5a0);
  uVar1 = (uint)local_600->_M_string_length;
  local_2b0._0_4_ = STATE_INITIAL;
  if ((int)uVar1 < 1) {
    uVar1 = 0;
  }
  for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
    local_5a0._M_buckets._0_4_ = toCharType(local_5f8,(local_600->_M_dataplus)._M_p[uVar6]);
    this_00 = &std::__detail::
               _Map_base<INumberJudger::State,_std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>,_std::allocator<std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::State>,_std::hash<INumberJudger::State>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<INumberJudger::State,_std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>,_std::allocator<std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::State>,_std::hash<INumberJudger::State>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_330,(key_type *)local_2b0)->_M_h;
    iVar2 = std::
            _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(this_00,(key_type *)&local_5a0);
    std::__detail::
    _Map_base<INumberJudger::State,_std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>,_std::allocator<std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::State>,_std::hash<INumberJudger::State>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
    ::operator[]((_Map_base<INumberJudger::State,_std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>,_std::allocator<std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::State>,_std::hash<INumberJudger::State>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)&local_330,(key_type *)local_2b0);
    if (iVar2.
        super__Node_iterator_base<std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_false>
        ._M_cur == (__node_type *)0x0) goto LAB_0010784c;
    this_01 = (_Map_base<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               *)std::__detail::
                 _Map_base<INumberJudger::State,_std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>,_std::allocator<std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::State>,_std::hash<INumberJudger::State>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<INumberJudger::State,_std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>,_std::allocator<std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::State>,_std::hash<INumberJudger::State>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&local_330,(key_type *)local_2b0);
    pmVar3 = std::__detail::
             _Map_base<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[](this_01,(key_type *)&local_5a0);
    local_2b0._0_4_ = *pmVar3;
  }
  if ((uint)local_2b0._0_4_ < (STATE_EXP_NUMBER|STATE_INTEGER)) {
    bVar4 = (byte)(0x32c >> ((byte)local_2b0._0_4_ & 0x1f));
  }
  else {
LAB_0010784c:
    bVar4 = 0;
  }
  std::
  _Hashtable<INumberJudger::State,_std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>,_std::allocator<std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::State>,_std::hash<INumberJudger::State>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_330);
  return (bool)(bVar4 & 1);
}

Assistant:

bool INumberJudger::isNumber(std::string s)
{
	std::unordered_map<State, std::unordered_map<CharType, State>> transfer{
		{STATE_INITIAL, {
							{CHAR_SPACE, STATE_INITIAL},
							{CHAR_NUMBER, STATE_INTEGER},
							{CHAR_POINT, STATE_POINT_WITHOUT_INT},
							{CHAR_SIGN, STATE_INT_SIGN},
						}},
		{STATE_INT_SIGN, {
							 {CHAR_NUMBER, STATE_INTEGER},
							 {CHAR_POINT, STATE_POINT_WITHOUT_INT},
						 }},
		{STATE_INTEGER, {
							{CHAR_NUMBER, STATE_INTEGER},
							{CHAR_EXP, STATE_EXP},
							{CHAR_POINT, STATE_POINT},
							{CHAR_SPACE, STATE_END},
						}},
		{STATE_POINT, {
						  {CHAR_NUMBER, STATE_FRACTION},
						  {CHAR_EXP, STATE_EXP},
						  {CHAR_SPACE, STATE_END},
					  }},
		{STATE_POINT_WITHOUT_INT, {
									  {CHAR_NUMBER, STATE_FRACTION},
								  }},
		{STATE_FRACTION, {
							 {CHAR_NUMBER, STATE_FRACTION},
							 {CHAR_EXP, STATE_EXP},
							 {CHAR_SPACE, STATE_END},
						 }},
		{STATE_EXP, {
						{CHAR_NUMBER, STATE_EXP_NUMBER},
						{CHAR_SIGN, STATE_EXP_SIGN},
					}},
		{STATE_EXP_SIGN, {
							 {CHAR_NUMBER, STATE_EXP_NUMBER},
						 }},
		{STATE_EXP_NUMBER, {
							   {CHAR_NUMBER, STATE_EXP_NUMBER},
							   {CHAR_SPACE, STATE_END},
						   }},
		{STATE_END, {
						{CHAR_SPACE, STATE_END},
					}}};

	int len = s.length();
	State st = STATE_INITIAL;

	for (int i = 0; i < len; i++)
	{
		CharType typ = toCharType(s[i]);
		if (transfer[st].find(typ) == transfer[st].end())
		{
			return false;
		}
		else
		{
			st = transfer[st][typ];
		}
	}
	return st == STATE_INTEGER || st == STATE_POINT || st == STATE_FRACTION || st == STATE_EXP_NUMBER || st == STATE_END;
}